

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  uhugeint_t shift;
  uhugeint_t shift_00;
  uhugeint_t input;
  uhugeint_t input_00;
  uhugeint_t input_01;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uhugeint_t uVar8;
  uint64_t in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      do {
        input_01.upper = in_stack_ffffffffffffffc8;
        input_01.lower = in_stack_ffffffffffffffc0;
        uVar8.upper = in_stack_ffffffffffffff98;
        uVar8.lower = 0x1c5b4dd;
        uVar8 = BitwiseShiftLeftOperator::
                Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>(input_01,uVar8);
        *(uint64_t *)((long)result_data + lVar5 + -8) = uVar8.lower;
        *(uint64_t *)((long)&result_data->lower + lVar5) = uVar8.upper;
        lVar5 = lVar5 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar2 = 0;
    uVar7 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar3 = 0xffffffffffffffff;
      }
      else {
        uVar3 = puVar1[uVar2];
      }
      uVar4 = uVar7 + 0x40;
      if (count <= uVar7 + 0x40) {
        uVar4 = count;
      }
      uVar6 = uVar4;
      if (uVar3 != 0) {
        uVar6 = uVar7;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar7 < uVar4) {
            uVar3 = uVar7 << 4 | 8;
            do {
              input.upper = in_stack_ffffffffffffffc8;
              input.lower = uVar2;
              shift.upper = in_stack_ffffffffffffff98;
              shift.lower = 0x1c5b422;
              uVar8 = BitwiseShiftLeftOperator::
                      Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                (input,shift);
              *(uint64_t *)((long)result_data + (uVar3 - 8)) = uVar8.lower;
              *(uint64_t *)((long)&result_data->lower + uVar3) = uVar8.upper;
              uVar7 = uVar7 + 1;
              uVar3 = uVar3 + 0x10;
              uVar6 = uVar7;
            } while (uVar4 != uVar7);
          }
        }
        else {
          in_stack_ffffffffffffffc8 = uVar7 - uVar4;
          if (uVar7 < uVar4) {
            uVar6 = uVar7 << 4 | 8;
            uVar4 = 0;
            do {
              if ((uVar3 >> (uVar4 & 0x3f) & 1) != 0) {
                input_00.upper = in_stack_ffffffffffffffc8;
                input_00.lower = uVar2;
                shift_00.upper = in_stack_ffffffffffffff98;
                shift_00.lower = 0x1c5b47d;
                uVar8 = BitwiseShiftLeftOperator::
                        Operation<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
                                  (input_00,shift_00);
                *(uint64_t *)((long)result_data + (uVar6 - 8)) = uVar8.lower;
                *(uint64_t *)((long)&result_data->lower + uVar6) = uVar8.upper;
              }
              uVar4 = uVar4 + 1;
              uVar6 = uVar6 + 0x10;
            } while (in_stack_ffffffffffffffc8 + uVar4 != 0);
            uVar6 = uVar7 + uVar4;
          }
        }
      }
      uVar2 = uVar2 + 1;
      uVar7 = uVar6;
    } while (uVar2 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}